

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O3

Hop_Obj_t ** Hop_TableFind(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  anon_union_8_2_6d2434d6_for_Hop_Obj_t__2 *paVar5;
  ulong uVar6;
  ulong uVar7;
  anon_union_8_2_6d2434d6_for_Hop_Obj_t__2 *paVar8;
  ulong uVar9;
  ulong uVar10;
  
  pHVar3 = pObj->pFanin0;
  if ((pHVar3 != (Hop_Obj_t *)0x0) && (pHVar4 = pObj->pFanin1, pHVar4 != (Hop_Obj_t *)0x0)) {
    iVar1 = *(int *)(((ulong)pHVar3 & 0xfffffffffffffffe) + 0x24);
    iVar2 = *(int *)(((ulong)pHVar4 & 0xfffffffffffffffe) + 0x24);
    if (iVar2 <= iVar1) {
      __assert_fail("Hop_ObjFanin0(pObj)->Id < Hop_ObjFanin1(pObj)->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTable.c"
                    ,0x2e,"Hop_Obj_t **Hop_TableFind(Hop_Man_t *, Hop_Obj_t *)");
    }
    uVar10 = 0;
    uVar9 = 0x6a3;
    if ((*(uint *)&pObj->field_0x20 & 7) != 5) {
      uVar9 = uVar10;
    }
    uVar6 = 0x38f;
    if (((ulong)pHVar3 & 1) == 0) {
      uVar6 = uVar10;
    }
    uVar7 = 0x161;
    if (((ulong)pHVar4 & 1) == 0) {
      uVar7 = uVar10;
    }
    paVar8 = (anon_union_8_2_6d2434d6_for_Hop_Obj_t__2 *)
             (p->pTable +
             ((long)iVar2 * 0xb9b ^ uVar9 ^ uVar7 ^ uVar6 ^ (long)iVar1 * 0x1f01) %
             (ulong)(long)p->nTableSize);
    do {
      paVar5 = paVar8;
      pHVar3 = paVar8->pNext;
      if (pHVar3 == (Hop_Obj_t *)0x0) {
        return (Hop_Obj_t **)paVar5;
      }
      paVar8 = &pHVar3->field_1;
    } while (pHVar3 != pObj);
    return (Hop_Obj_t **)paVar5;
  }
  __assert_fail("Hop_ObjChild0(pObj) && Hop_ObjChild1(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTable.c"
                ,0x2d,"Hop_Obj_t **Hop_TableFind(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

static Hop_Obj_t ** Hop_TableFind( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    Hop_Obj_t ** ppEntry;
    assert( Hop_ObjChild0(pObj) && Hop_ObjChild1(pObj) );
    assert( Hop_ObjFanin0(pObj)->Id < Hop_ObjFanin1(pObj)->Id );
    for ( ppEntry = p->pTable + Hop_Hash(pObj, p->nTableSize); *ppEntry; ppEntry = &(*ppEntry)->pNext )
        if ( *ppEntry == pObj )
            return ppEntry;
    assert( *ppEntry == NULL );
    return ppEntry;
}